

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

TaggedShapeFactory *
s2shapeutil::FullDecodeShapeFactory(TaggedShapeFactory *__return_storage_ptr__,Decoder *decoder)

{
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = FullDecodeShape;
  local_10 = std::
             _Function_handler<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*),_std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(*)(unsigned_int,_Decoder_*)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*),_std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(*)(unsigned_int,_Decoder_*)>
             ::_M_manager;
  TaggedShapeFactory::TaggedShapeFactory(__return_storage_ptr__,(ShapeDecoder *)local_28,decoder);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return __return_storage_ptr__;
}

Assistant:

TaggedShapeFactory FullDecodeShapeFactory(Decoder* decoder) {
  return TaggedShapeFactory(FullDecodeShape, decoder);
}